

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O1

int run_test_ip6_pton(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  in6_addr addr;
  undefined1 auStack_18 [16];
  
  puVar2 = (uv_loop_t *)0xa;
  iVar1 = uv_inet_pton(10,"::",auStack_18);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eed1;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015eed6;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015eedb;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eee0;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eee5;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015eeea;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"::1%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015eeef;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eef4;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015eef9;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015eefe;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::1%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef03;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef08;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef0d;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef12;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef17;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef1c;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef21;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef26;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef2b;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef30;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef35;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef3a;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef3f;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef44;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef49;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef4e;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef53;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef58;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef5d;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%%%%",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef62;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1:1.2.3.4",auStack_18);
    if (iVar1 != 0) goto LAB_0015ef67;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef6c;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef71;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef76;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,":::1%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef7b;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef80;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef85;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef8a;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"abcde::1%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef8f;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef94;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef99;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015ef9e;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015efa3;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015efa8;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015efad;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015efb2;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015efb7;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5",auStack_18);
    if (iVar1 == 0) goto LAB_0015efbc;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015efc1;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015efc6;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1:1.2.3.4",auStack_18);
    if (iVar1 == 0) goto LAB_0015efcb;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255",auStack_18);
    if (iVar1 == 0) goto LAB_0015efd0;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1",auStack_18);
    if (iVar1 == 0) goto LAB_0015efd5;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%%%%",auStack_18);
    if (iVar1 == 0) goto LAB_0015efda;
    puVar2 = (uv_loop_t *)0xa;
    iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1:1.2.3.4",
                         auStack_18);
    if (iVar1 != 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015efe4;
    }
  }
  else {
    run_test_ip6_pton_cold_1();
LAB_0015eed1:
    run_test_ip6_pton_cold_2();
LAB_0015eed6:
    run_test_ip6_pton_cold_3();
LAB_0015eedb:
    run_test_ip6_pton_cold_4();
LAB_0015eee0:
    run_test_ip6_pton_cold_5();
LAB_0015eee5:
    run_test_ip6_pton_cold_6();
LAB_0015eeea:
    run_test_ip6_pton_cold_7();
LAB_0015eeef:
    run_test_ip6_pton_cold_8();
LAB_0015eef4:
    run_test_ip6_pton_cold_9();
LAB_0015eef9:
    run_test_ip6_pton_cold_10();
LAB_0015eefe:
    run_test_ip6_pton_cold_11();
LAB_0015ef03:
    run_test_ip6_pton_cold_12();
LAB_0015ef08:
    run_test_ip6_pton_cold_13();
LAB_0015ef0d:
    run_test_ip6_pton_cold_14();
LAB_0015ef12:
    run_test_ip6_pton_cold_15();
LAB_0015ef17:
    run_test_ip6_pton_cold_16();
LAB_0015ef1c:
    run_test_ip6_pton_cold_17();
LAB_0015ef21:
    run_test_ip6_pton_cold_18();
LAB_0015ef26:
    run_test_ip6_pton_cold_19();
LAB_0015ef2b:
    run_test_ip6_pton_cold_20();
LAB_0015ef30:
    run_test_ip6_pton_cold_21();
LAB_0015ef35:
    run_test_ip6_pton_cold_22();
LAB_0015ef3a:
    run_test_ip6_pton_cold_23();
LAB_0015ef3f:
    run_test_ip6_pton_cold_24();
LAB_0015ef44:
    run_test_ip6_pton_cold_25();
LAB_0015ef49:
    run_test_ip6_pton_cold_26();
LAB_0015ef4e:
    run_test_ip6_pton_cold_27();
LAB_0015ef53:
    run_test_ip6_pton_cold_28();
LAB_0015ef58:
    run_test_ip6_pton_cold_29();
LAB_0015ef5d:
    run_test_ip6_pton_cold_30();
LAB_0015ef62:
    run_test_ip6_pton_cold_31();
LAB_0015ef67:
    run_test_ip6_pton_cold_32();
LAB_0015ef6c:
    run_test_ip6_pton_cold_57();
LAB_0015ef71:
    run_test_ip6_pton_cold_56();
LAB_0015ef76:
    run_test_ip6_pton_cold_55();
LAB_0015ef7b:
    run_test_ip6_pton_cold_54();
LAB_0015ef80:
    run_test_ip6_pton_cold_53();
LAB_0015ef85:
    run_test_ip6_pton_cold_52();
LAB_0015ef8a:
    run_test_ip6_pton_cold_51();
LAB_0015ef8f:
    run_test_ip6_pton_cold_50();
LAB_0015ef94:
    run_test_ip6_pton_cold_49();
LAB_0015ef99:
    run_test_ip6_pton_cold_48();
LAB_0015ef9e:
    run_test_ip6_pton_cold_47();
LAB_0015efa3:
    run_test_ip6_pton_cold_46();
LAB_0015efa8:
    run_test_ip6_pton_cold_45();
LAB_0015efad:
    run_test_ip6_pton_cold_44();
LAB_0015efb2:
    run_test_ip6_pton_cold_43();
LAB_0015efb7:
    run_test_ip6_pton_cold_42();
LAB_0015efbc:
    run_test_ip6_pton_cold_41();
LAB_0015efc1:
    run_test_ip6_pton_cold_40();
LAB_0015efc6:
    run_test_ip6_pton_cold_39();
LAB_0015efcb:
    run_test_ip6_pton_cold_38();
LAB_0015efd0:
    run_test_ip6_pton_cold_37();
LAB_0015efd5:
    run_test_ip6_pton_cold_36();
LAB_0015efda:
    run_test_ip6_pton_cold_35();
  }
  run_test_ip6_pton_cold_34();
LAB_0015efe4:
  run_test_ip6_pton_cold_33();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ip6_pton) {
  struct in6_addr addr;

  GOOD_ADDR_LIST(TEST_GOOD)
  BAD_ADDR_LIST(TEST_BAD)

  MAKE_VALGRIND_HAPPY();
  return 0;
}